

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void counting_illegal_callback_fn(char *str,void *data)

{
  secp256k1_gej sStack_b8;
  
  if (*data != 0x7fffffff) {
    *(int *)data = *data + 1;
    return;
  }
  counting_illegal_callback_fn_cold_1();
  secp256k1_gej_verify((secp256k1_gej *)data);
  secp256k1_gej_verify((secp256k1_gej *)str);
  secp256k1_gej_neg(&sStack_b8,(secp256k1_gej *)str);
  secp256k1_gej_add_var(&sStack_b8,&sStack_b8,(secp256k1_gej *)data,(secp256k1_fe *)0x0);
  secp256k1_gej_verify(&sStack_b8);
  return;
}

Assistant:

static void counting_illegal_callback_fn(const char* str, void* data) {
    /* Dummy callback function that just counts. */
    int32_t *p;
    (void)str;
    p = data;
    CHECK(*p != INT32_MAX);
    (*p)++;
}